

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.h
# Opt level: O0

void wait_clear_reg32(uint8_t *addr,int reg,uint32_t mask)

{
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  uint32_t cur;
  
  while ((*(uint *)(in_RDI + in_ESI) & in_EDX) != 0) {
    fprintf(_stderr,
            "[DEBUG] %s:%d %s(): waiting for flags 0x%08X in register 0x%05X to clear, current value 0x%08X\n"
            ,"/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/device.h",
            0x7a,"wait_clear_reg32",(ulong)in_EDX,in_ESI,*(uint *)(in_RDI + in_ESI));
    usleep(10000);
  }
  return;
}

Assistant:

static inline void wait_clear_reg32(const uint8_t* addr, int reg, uint32_t mask) {
	__asm__ volatile ("" : : : "memory");
	uint32_t cur = 0;
	while (cur = *((volatile uint32_t*) (addr + reg)), (cur & mask) != 0) {
		debug("waiting for flags 0x%08X in register 0x%05X to clear, current value 0x%08X", mask, reg, cur);
		usleep(10000);
		__asm__ volatile ("" : : : "memory");
	}
}